

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O3

void object_absorb_merge(object *obj1,object *obj2)

{
  _Bool _Var1;
  int16_t iVar2;
  int iVar3;
  
  if ((obj1->known != (object *)0x0) && (obj2->known != (object *)0x0)) {
    if (obj2->known->effect != (effect *)0x0) {
      obj1->known->effect = obj1->effect;
    }
    player_know_object(player,obj1);
  }
  if (obj2->note != 0) {
    obj1->note = obj2->note;
  }
  _Var1 = tval_can_have_timeout(obj1);
  if (_Var1) {
    obj1->timeout = obj1->timeout + obj2->timeout;
  }
  _Var1 = tval_can_have_charges(obj1);
  if (!_Var1) {
    _Var1 = tval_is_money(obj1);
    if (!_Var1) goto LAB_001925b2;
  }
  iVar3 = (int)obj2->pval + (int)obj1->pval;
  iVar2 = (int16_t)iVar3;
  if (0x7ffe < iVar3) {
    iVar2 = 0x7fff;
  }
  obj1->pval = iVar2;
LAB_001925b2:
  object_origin_combine(obj1,obj2);
  return;
}

Assistant:

static void object_absorb_merge(struct object *obj1, const struct object *obj2)
{
	int total;

	/* First object gains any extra knowledge from second */
	if (obj1->known && obj2->known) {
		if (obj2->known->effect)
			obj1->known->effect = obj1->effect;
		player_know_object(player, obj1);
	}

	/* Merge inscriptions */
	if (obj2->note)
		obj1->note = obj2->note;

	/* Combine timeouts for rod stacking */
	if (tval_can_have_timeout(obj1))
		obj1->timeout += obj2->timeout;

	/* Combine pvals for wands and staves */
	if (tval_can_have_charges(obj1) || tval_is_money(obj1)) {
		total = obj1->pval + obj2->pval;
		obj1->pval = total >= MAX_PVAL ? MAX_PVAL : total;
	}

	/* Combine origin data as best we can */
	object_origin_combine(obj1, obj2);
}